

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Run.h
# Opt level: O1

void gurkenlaeufer::detail::
     runStepList<std::__cxx11::list<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseStep*>,std::allocator<std::pair<std::__cxx11::string,gurkenlaeufer::detail::BaseStep*>>>>
               (ScenarioContext *scenarioContext,
               list<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *list,
               list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>
               *registry,bool ignoreNotFound)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  pointer pbVar1;
  pointer pbVar2;
  BaseStep *pBVar3;
  pointer pMVar4;
  bool bVar5;
  ostream *poVar6;
  long *plVar7;
  runtime_error *prVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  pointer pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _List_node_base *p_Var12;
  pointer pMVar13;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__args;
  size_t i;
  ulong uVar14;
  value_type *matchingStep;
  long lVar15;
  _List_node_base *p_Var16;
  smatch match;
  MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>
  mathingStep;
  vector<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
  matchingSteps;
  undefined1 local_d8 [32];
  undefined1 local_b8 [8];
  pointer pbStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a8;
  undefined4 local_8c;
  vector<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
  local_88;
  _List_node_base *local_70;
  ScenarioContext *local_68;
  _List_node_base *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_8c = (undefined4)CONCAT71(in_register_00000009,ignoreNotFound);
  p_Var16 = (list->super__List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var16 != (_List_node_base *)list) {
    this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(local_b8 + 8);
    local_70 = (_List_node_base *)registry;
    local_68 = scenarioContext;
    local_60 = (_List_node_base *)list;
    do {
      local_88.
      super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var12 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>
                   *)&local_70->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var12 != local_70) {
        local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (p_Var16 + 3);
        do {
          local_d8._16_8_ = (pointer)0x0;
          local_d8._24_8_ = 0;
          local_d8._0_8_ = (pointer)0x0;
          local_d8._8_8_ = (pointer)0x0;
          std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
          basic_regex<std::char_traits<char>,std::allocator<char>>
                    ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var12 + 1),0x10);
          bVar5 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )p_Var16[1]._M_next,
                             (char *)((long)p_Var16[1]._M_next + (long)p_Var16[1]._M_prev),
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_d8,
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_b8,0);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_b8);
          if (bVar5) {
            pbStack_b0 = (pointer)0x0;
            aStack_a8._M_allocated_capacity = 0;
            aStack_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            uVar14 = 1;
            lVar15 = 0x18;
            local_b8 = (undefined1  [8])(p_Var12 + 1);
            while( true ) {
              if (local_d8._0_8_ == local_d8._8_8_) {
                uVar9 = 0;
              }
              else {
                uVar9 = ((long)(local_d8._8_8_ - local_d8._0_8_) >> 3) * -0x5555555555555555 - 3;
              }
              if (uVar9 <= uVar14) break;
              if (local_d8._0_8_ == local_d8._8_8_) {
                uVar9 = 0;
              }
              else {
                uVar9 = ((long)(local_d8._8_8_ - local_d8._0_8_) >> 3) * -0x5555555555555555 - 3;
              }
              if (uVar14 < uVar9) {
                __args = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_d8._0_8_ + lVar15);
              }
              else {
                __args = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&((pointer)(local_d8._8_8_ + -0x60))->field_2 + 8);
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>const&>
                        (this,__args);
              uVar14 = uVar14 + 1;
              lVar15 = lVar15 + 0x18;
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>(this,local_58);
            std::
            vector<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
            ::push_back(&local_88,(value_type *)local_b8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this);
          }
          if ((pointer)local_d8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_d8._0_8_);
          }
          p_Var12 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>
                       *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        } while (p_Var12 != local_70);
      }
      pMVar4 = local_88.
               super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (0x20 < (ulong)((long)local_88.
                               super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_88.
                              super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,"Ambiguous step definitions found for step: \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var16 + 1));
        plVar7 = (long *)std::__cxx11::string::append(local_b8);
        local_d8._0_8_ = *plVar7;
        pbVar10 = (pointer)(plVar7 + 2);
        if ((pointer)local_d8._0_8_ == pbVar10) {
          local_d8._16_8_ = (pbVar10->_M_dataplus)._M_p;
          local_d8._24_8_ = plVar7[3];
          local_d8._0_8_ = (pointer)(local_d8 + 0x10);
        }
        else {
          local_d8._16_8_ = (pbVar10->_M_dataplus)._M_p;
        }
        local_d8._8_8_ = plVar7[1];
        *plVar7 = (long)pbVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_b8 != (undefined1  [8])&aStack_a8) {
          operator_delete((void *)local_b8);
        }
        pMVar4 = local_88.
                 super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_88.
            super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_88.
            super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pMVar13 = local_88.
                    super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::operator+(&local_50,"\n\'",&pMVar13->stepDefinition->first);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 == paVar11) {
              aStack_a8._M_allocated_capacity = paVar11->_M_allocated_capacity;
              aStack_a8._8_8_ = plVar7[3];
              local_b8 = (undefined1  [8])&aStack_a8;
            }
            else {
              aStack_a8._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_b8 = (undefined1  [8])*plVar7;
            }
            pbStack_b0 = (pointer)plVar7[1];
            *plVar7 = (long)paVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append(local_d8,(ulong)local_b8);
            if (local_b8 != (undefined1  [8])&aStack_a8) {
              operator_delete((void *)local_b8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            pMVar13 = pMVar13 + 1;
          } while (pMVar13 != pMVar4);
        }
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,(char *)local_d8._0_8_);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_88.
          super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_88.
          super__Vector_base<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if ((char)local_8c == '\0') {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d8,"Did not find matching step for line: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var16 + 1));
          std::runtime_error::runtime_error(prVar8,(string *)local_d8);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)p_Var16[1]._M_next,
                            (long)p_Var16[1]._M_prev);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        (pMVar4->stepDefinition->second->super_CommonStep<gurkenlaeufer::detail::BaseStep>).
        _scenarioContext = local_68;
        pbVar10 = (pMVar4->params).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = (pMVar4->params).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar2 = (pMVar4->params).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pMVar4->params).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pMVar4->params).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pMVar4->params).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8._24_8_ = 0;
        pBVar3 = pMVar4->stepDefinition->second;
        local_b8 = (undefined1  [8])
                   (pBVar3->super_CommonStep<gurkenlaeufer::detail::BaseStep>)._stepContext._params.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbStack_b0 = (pBVar3->super_CommonStep<gurkenlaeufer::detail::BaseStep>)._stepContext.
                     _params.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        aStack_a8._M_allocated_capacity =
             (size_type)
             (pBVar3->super_CommonStep<gurkenlaeufer::detail::BaseStep>)._stepContext._params.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pBVar3->super_CommonStep<gurkenlaeufer::detail::BaseStep>)._stepContext._params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar10;
        (pBVar3->super_CommonStep<gurkenlaeufer::detail::BaseStep>)._stepContext._params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
        (pBVar3->super_CommonStep<gurkenlaeufer::detail::BaseStep>)._stepContext._params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar2;
        local_d8._0_8_ = (pointer)0x0;
        local_d8._8_8_ = (pointer)0x0;
        local_d8._16_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b8);
        (pBVar3->super_CommonStep<gurkenlaeufer::detail::BaseStep>)._stepContext._currentParamIdx =
             local_d8._24_8_;
        (*(pMVar4->stepDefinition->second->super_CommonStep<gurkenlaeufer::detail::BaseStep>).
          _vptr_CommonStep[2])();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d8);
      }
      std::
      vector<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>,_std::allocator<gurkenlaeufer::detail::MatchingSteps<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gurkenlaeufer::detail::BaseStep_*>_>_>_>_>_>
      ::~vector(&local_88);
      p_Var16 = (((_List_base<gurkenlaeufer::Step,_std::allocator<gurkenlaeufer::Step>_> *)
                 &p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var16 != local_60);
  }
  return;
}

Assistant:

void runStepList(ScenarioContext& scenarioContext, const std::list<Step>& list, const T& registry, bool ignoreNotFound)
    {
        for (const auto& step : list) {

            std::vector<MatchingSteps<T>> matchingSteps;

            for (const auto& entry : registry) {
                std::smatch match;
                if (std::regex_match(step.step, match, std::regex(entry.first))) {
                    MatchingSteps<T> mathingStep;
                    mathingStep.stepDefinition = &entry;
                    for (size_t i = 1; i < match.size(); ++i) {
                        mathingStep.params.emplace_back(match[i]);
                    }
                    mathingStep.params.emplace_back(step.docString);
                    matchingSteps.push_back(mathingStep);
                }
            }

            if (matchingSteps.size() > 1u) {
                std::string msg = "Ambiguous step definitions found for step: '" + step.step + "'. \nPossible matches:";
                for (const auto& matchingStep : matchingSteps) {
                    msg += "\n'" + matchingStep.stepDefinition->first + "'";
                }
                throw std::runtime_error(msg.c_str());
            } else if (matchingSteps.size() == 0u) {
                if (!ignoreNotFound) {
                    throw std::runtime_error("Did not find matching step for line: " + step.step);
                }
            } else {
                auto& matchingStep = matchingSteps[0u];
                std::cout << "[" << step.step << "]" << std::endl;
                matchingStep.stepDefinition->second->setScenarioContext(&scenarioContext);
                StepContext stepCtx(std::move(matchingStep.params));
                matchingStep.stepDefinition->second->setStepContext(std::move(stepCtx));
                matchingStep.stepDefinition->second->runStep();
            }
        }
    }